

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O2

void tcu::anon_unknown_0::decompressEAC_R11(PixelBufferAccess *dst,deUint8 *src,bool signedMode)

{
  int iVar1;
  void *pvVar2;
  ushort uVar3;
  deUint64 src_00;
  int x;
  long lVar4;
  int iVar5;
  int y;
  long lVar6;
  deUint8 *dst_00;
  deUint8 uncompressedBlock [32];
  deUint8 local_58 [40];
  
  pvVar2 = (dst->super_ConstPixelBufferAccess).m_data;
  iVar1 = (dst->super_ConstPixelBufferAccess).m_pitch.m_data[1];
  iVar5 = 0;
  src_00 = EtcDecompressInternal::get64BitBlock(src,0);
  dst_00 = local_58;
  EtcDecompressInternal::decompressEAC11Block(dst_00,src_00,signedMode);
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      uVar3 = *(ushort *)(dst_00 + lVar4 * 2);
      if (signedMode) {
        uVar3 = EtcDecompressInternal::extend11To16WithSign(uVar3);
      }
      else {
        uVar3 = uVar3 >> 6 | uVar3 << 5;
      }
      *(ushort *)((long)pvVar2 + lVar4 * 2 + (long)iVar5) = uVar3;
    }
    dst_00 = dst_00 + 8;
    iVar5 = iVar5 + iVar1;
  }
  return;
}

Assistant:

void decompressEAC_R11 (const PixelBufferAccess& dst, const deUint8* src, bool signedMode)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_R11;

	const deUint64	compressedBlock = get64BitBlock(src, 0);
	deUint8			uncompressedBlock[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];

	// Decompress.
	decompressEAC11Block(uncompressedBlock, compressedBlock, signedMode);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_R11 == 2);

			if (signedMode)
			{
				const deInt16* const	srcPixel = (deInt16*)&uncompressedBlock[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deInt16* const			dstPixel = (deInt16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16WithSign(srcPixel[0]);
			}
			else
			{
				const deUint16* const	srcPixel = (deUint16*)&uncompressedBlock[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deUint16* const			dstPixel = (deUint16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16(srcPixel[0]);
			}
		}
	}
}